

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocess.cpp
# Opt level: O0

void __thiscall tsbp::PreprocessPacking2D::Run(PreprocessPacking2D *this)

{
  double *this_00;
  ostream *poVar1;
  size_type sVar2;
  size_type sVar3;
  undefined1 local_78 [24];
  double dStack_60;
  undefined1 auStack_48 [8];
  Bin newContainer;
  vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> newItems;
  PreprocessPacking2D *this_local;
  
  InitializeInternIds(this,(vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)&this->items
                     );
  this_00 = &newContainer.super_Rectangle.Area;
  CLI::std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::vector
            ((vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)this_00,&this->items);
  auStack_48._0_4_ = (this->container).super_Rectangle.X;
  auStack_48._4_4_ = (this->container).super_Rectangle.Y;
  newContainer.super_Rectangle.X = (this->container).super_Rectangle.Dx;
  newContainer.super_Rectangle.Y = (this->container).super_Rectangle.Dy;
  newContainer.super_Rectangle.Dx = (this->container).super_Rectangle.InternId;
  newContainer.super_Rectangle.Dy = (this->container).super_Rectangle.ExternId;
  newContainer.super_Rectangle._16_8_ = (this->container).super_Rectangle.Area;
  RemoveLargeItems(this,(vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)this_00,
                   (Bin *)auStack_48);
  FilterFrameConfigurations
            (this,(vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)
                  &newContainer.super_Rectangle.Area,(Bin *)auStack_48);
  Bin::Bin((Bin *)local_78,0,0,newContainer.super_Rectangle.X,newContainer.super_Rectangle.Y,-1,-1);
  newContainer.super_Rectangle.Dx = local_78._16_4_;
  newContainer.super_Rectangle.Dy = local_78._20_4_;
  newContainer.super_Rectangle._16_8_ = dStack_60;
  auStack_48 = (undefined1  [8])local_78._0_8_;
  newContainer.super_Rectangle.X = local_78._8_4_;
  newContainer.super_Rectangle.Y = local_78._12_4_;
  poVar1 = std::operator<<((ostream *)&std::cout,"Preprocess removed ");
  sVar2 = CLI::std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::size(&this->items);
  sVar3 = CLI::std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::size
                    ((vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)
                     &newContainer.super_Rectangle.Area);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sVar2 - sVar3);
  poVar1 = std::operator<<(poVar1," items ");
  poVar1 = std::operator<<(poVar1,"and reduced container area by ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(this->container).super_Rectangle.Area -
                             (double)newContainer.super_Rectangle._16_8_);
  std::operator<<(poVar1,".\n");
  InitializeInternIds(this,(vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)
                           &newContainer.super_Rectangle.Area);
  (this->PreprocessedContainer).super_Rectangle.InternId = newContainer.super_Rectangle.Dx;
  (this->PreprocessedContainer).super_Rectangle.ExternId = newContainer.super_Rectangle.Dy;
  (this->PreprocessedContainer).super_Rectangle.Area = (double)newContainer.super_Rectangle._16_8_;
  (this->PreprocessedContainer).super_Rectangle.X = auStack_48._0_4_;
  (this->PreprocessedContainer).super_Rectangle.Y = auStack_48._4_4_;
  (this->PreprocessedContainer).super_Rectangle.Dx = newContainer.super_Rectangle.X;
  (this->PreprocessedContainer).super_Rectangle.Dy = newContainer.super_Rectangle.Y;
  std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::operator=
            ((vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)this,
             (vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)
             &newContainer.super_Rectangle.Area);
  CLI::std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::~vector
            ((vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *)
             &newContainer.super_Rectangle.Area);
  return;
}

Assistant:

void PreprocessPacking2D::Run()
{
    InitializeInternIds(this->items);

    std::vector<Rectangle> newItems = this->items;
    Bin newContainer = this->container;

    RemoveLargeItems(newItems, newContainer);
    FilterFrameConfigurations(newItems, newContainer);
    ////EnlargeItemsByOrthogonalPacking(newItems, newContainer);

    // Reconstruct to correctly initialize area and volume.
    newContainer = Bin(0, 0, newContainer.Dx, newContainer.Dy, -1, -1);

    std::cout << "Preprocess removed " << this->items.size() - newItems.size() << " items "
              << "and reduced container area by " << this->container.Area - newContainer.Area << ".\n";

    InitializeInternIds(newItems);

    PreprocessedContainer = newContainer;
    ProcessedItems = newItems;
}